

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_gamma_file3.hpp
# Opt level: O3

pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
* __thiscall
packed_gamma_file3<unsigned_int,_6UL>::run_length_encode
          (pair<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
           *__return_storage_ptr__,packed_gamma_file3<unsigned_int,_6UL> *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *V)

{
  iterator iVar1;
  pointer puVar2;
  pointer puVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  uint local_34;
  
  (__return_storage_ptr__->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->first).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->second).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  puVar3 = (V->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar2 = (V->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)puVar3 - (long)puVar2 != 0) {
    uVar5 = (long)puVar3 - (long)puVar2 >> 2;
    uVar4 = 1;
    uVar6 = 0;
    do {
      if ((uVar5 - 1 == uVar6) || (puVar2[uVar6] != puVar2[(int)uVar6 + 1])) {
        iVar1._M_current =
             (__return_storage_ptr__->first).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->first).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__,
                     iVar1,&local_34);
          puVar2 = (V->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        }
        else {
          *iVar1._M_current = uVar4;
          (__return_storage_ptr__->first).
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        iVar1._M_current =
             (__return_storage_ptr__->second).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->second).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                     &__return_storage_ptr__->second,iVar1,puVar2 + uVar6);
          puVar2 = (V->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        }
        else {
          *iVar1._M_current = puVar2[uVar6];
          (__return_storage_ptr__->second).
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        puVar3 = (V->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        uVar4 = 1;
      }
      else {
        uVar4 = uVar4 + 1;
      }
      uVar6 = (ulong)((int)uVar6 + 1);
      uVar5 = (long)puVar3 - (long)puVar2 >> 2;
    } while (uVar6 < uVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

pair<vector<itype>, vector<itype> > run_length_encode(vector<itype> & V){

		pair<vector<itype>, vector<itype> > R;
		itype l = 1;
		itype n = 0;

		for(itype i=0;i<V.size();++i){

			if(i == V.size()-1 || V[i] != V[i+1]){

				R.first.push_back(l);
				R.second.push_back(V[i]);

				n+=l;

				l = 1;

			}else{

				++l;

			}

		}

		assert(n == V.size());

		return R;

	}